

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_TestHarness_c_checkLongLongInt_TestShell::createTest
          (TEST_TestHarness_c_checkLongLongInt_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x10,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                                  ,0x106);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0037fad0;
  return this_00;
}

Assistant:

TEST(TestHarness_c, checkLongLongInt)
{
    CHECK_EQUAL_C_LONGLONG(2, 2);
    fixture->setTestFunction(failLongLongIntMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}